

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_import(Context *context,IntrinsicResult *partialResult)

{
  long *plVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  RefCountedStorage *pRVar5;
  undefined8 uVar6;
  ListStorage<MiniScript::String> *pLVar7;
  undefined1 auVar8 [8];
  uint uVar9;
  int iVar10;
  long *plVar11;
  undefined8 *puVar12;
  StringStorage *pSVar13;
  char *pcVar14;
  anon_union_8_3_2f476f46_for_data aVar15;
  _func_int **pp_Var16;
  String *pSVar17;
  StringStorage *pSVar18;
  size_t sVar19;
  anon_union_8_3_2f476f46_for_data aVar20;
  anon_union_8_3_2f476f46_for_data __s;
  anon_union_8_3_2f476f46_for_data aVar21;
  _func_int **__s_00;
  FILE *__stream;
  undefined4 extraout_var;
  FunctionStorage *func;
  long maxi;
  byte *pbVar22;
  size_t sVar23;
  long *in_RDX;
  undefined1 *puVar24;
  RefCountedStorage *pRVar25;
  size_t *psVar26;
  ulong uVar27;
  undefined1 *puVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  size_t sVar31;
  undefined1 *puVar32;
  unsigned_long uVar33;
  Context *pCVar34;
  bool bVar35;
  Value importedValues;
  String libname_1;
  Value searchPath;
  String moduleSource;
  String libname;
  Parser parser;
  anon_union_8_3_2f476f46_for_data local_248;
  anon_union_8_3_2f476f46_for_data local_240;
  anon_union_8_3_2f476f46_for_data local_238;
  anon_union_8_3_2f476f46_for_data local_230;
  undefined1 local_228 [8];
  anon_union_8_3_2f476f46_for_data local_220;
  anon_union_8_3_2f476f46_for_data local_218;
  anon_union_8_3_2f476f46_for_data local_210;
  ValueType local_208;
  anon_union_8_3_2f476f46_for_data local_200;
  Value local_1f8;
  anon_union_8_3_2f476f46_for_data local_1e8;
  anon_union_8_3_2f476f46_for_data local_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  _func_int **local_1b8;
  anon_union_8_3_2f476f46_for_data local_1b0;
  ListStorage<MiniScript::Context_*> *local_1a8;
  String local_1a0;
  anon_union_8_3_2f476f46_for_data local_190;
  String *local_188;
  String local_180;
  List<MiniScript::String> local_170;
  anon_union_8_3_2f476f46_for_data local_160;
  char local_158;
  Value local_150;
  String local_140;
  Value local_130;
  undefined1 local_120 [8];
  StringStorage *local_118;
  bool local_110;
  int local_108;
  StringStorage *local_100;
  anon_union_8_3_2f476f46_for_data local_f8 [13];
  StringStorage *local_90;
  char local_88;
  anon_union_8_3_2f476f46_for_data local_80;
  char local_78;
  long *local_70;
  char local_68;
  Context *local_60;
  ulong local_58;
  Value local_50;
  unsigned_long local_40;
  unsigned_long local_38;
  
  iVar10 = (int)&local_248;
  if (*in_RDX == 0) {
    pbVar22 = &MiniScript::Value::null;
  }
  else {
    pbVar22 = (byte *)(*in_RDX + 0x18);
  }
  bVar2 = *pbVar22;
  plVar11 = *(long **)(pbVar22 + 8);
  local_188 = (String *)partialResult;
  local_60 = context;
  if (plVar11 == (long *)0x0 || bVar2 < 3) {
    bVar35 = bVar2 == 0;
    if (plVar11 != (long *)0x0 && 2 < bVar2) goto LAB_0012178c;
    if (bVar2 == 0) goto LAB_0012179d;
  }
  else {
    plVar11[1] = plVar11[1] + 1;
    bVar35 = false;
LAB_0012178c:
    plVar1 = plVar11 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*plVar11 + 8))();
    }
    if (bVar35) {
LAB_0012179d:
      local_68 = '\0';
      plVar11 = (long *)operator_new(0x30);
      plVar11[1] = 1;
      *plVar11 = (long)&PTR__StringStorage_001bf0d8;
      plVar11[3] = 8;
      plVar11[4] = -1;
      puVar12 = (undefined8 *)operator_new__(8);
      plVar11[2] = (long)puVar12;
      *puVar12 = 0x656d616e62696c;
      local_70 = plVar11;
      MiniScript::Context::GetVar((Context *)&local_248,local_188,(LocalOnlyMode)&local_70);
      MiniScript::Value::ToString((Value *)&local_160,(Machine *)&local_248);
      if ((2 < (byte)local_248.tempNum._0_1_) && (local_240.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_240.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_240.ref)->_vptr_RefCountedStorage[1])();
        }
        local_240.number = 0.0;
      }
      if ((local_70 != (long *)0x0) && (local_68 == '\0')) {
        plVar11 = local_70 + 1;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (**(code **)(*local_70 + 8))();
        }
        local_70 = (long *)0x0;
      }
      if ((local_160.ref == (RefCountedStorage *)0x0) || ((ulong)local_160.ref[1].refCount < 2)) {
        pSVar13 = (StringStorage *)operator_new(0x30);
        (pSVar13->super_RefCountedStorage).refCount = 1;
        (pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage =
             (_func_int **)&PTR__StringStorage_001bf0d8;
        pSVar13->dataSize = 0x19;
        pSVar13->charCount = -1;
        pcVar14 = (char *)operator_new__(0x19);
        pSVar13->data = pcVar14;
        builtin_strncpy(pcVar14,"import: libname required",0x19);
        (pSVar13->super_RefCountedStorage).refCount = 2;
        local_118 = (StringStorage *)0x0;
        local_110 = false;
        local_108 = 0;
        local_f8[0].tempNum._0_1_ = false;
        local_120 = (undefined1  [8])&PTR__MiniscriptException_001bf310;
        local_100 = pSVar13;
        MiniScript::RuntimeException::raise((RuntimeException *)local_120,iVar10);
        local_120 = (undefined1  [8])&PTR__MiniscriptException_001bf360;
        if ((local_100 != (StringStorage *)0x0) && ((bool)local_f8[0]._0_1_ == false)) {
          plVar11 = &(local_100->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_100->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_100 = (StringStorage *)0x0;
        }
        if ((local_118 != (StringStorage *)0x0) && (local_110 == false)) {
          plVar11 = &(local_118->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_118->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_118 = (StringStorage *)0x0;
        }
        std::exception::~exception((exception *)local_120);
        plVar11 = &(pSVar13->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar13);
        }
      }
      getEnvMap();
      pSVar13 = local_118;
      if (local_118 == (StringStorage *)0x0) {
        local_1b0.tempNum._0_1_ = MiniScript::Value::null;
        local_1b0.tempNum._1_2_ = _DAT_001c1321;
        local_1a8 = DAT_001c1328;
        if (DAT_001c1328 != (ListStorage<MiniScript::Context_*> *)0x0 && 2 < MiniScript::Value::null
           ) goto LAB_00121c6e;
      }
      else {
        uVar9 = MiniScript::HashValue(&_MS_IMPORT_PATH);
        psVar26 = &pSVar13->dataSize + uVar9 % 0xfb;
        do {
          psVar26 = (size_t *)*psVar26;
          if (psVar26 == (size_t *)0x0) {
            local_1b0.tempNum._1_2_ = _DAT_001c1321;
            local_1a8 = DAT_001c1328;
            local_1b0.tempNum._0_1_ = MiniScript::Value::null;
            goto LAB_00121c55;
          }
          bVar35 = MiniScript::Value::operator==((Value *)(psVar26 + 1),&_MS_IMPORT_PATH);
        } while (!bVar35);
        local_1b0.tempNum._1_2_ = *(undefined2 *)((long)psVar26 + 0x19);
        local_1a8 = (ListStorage<MiniScript::Context_*> *)psVar26[4];
        local_1b0.tempNum._0_1_ = *(byte *)(psVar26 + 3);
LAB_00121c55:
        if (local_1a8 != (ListStorage<MiniScript::Context_*> *)0x0 &&
            2 < (byte)local_1b0.tempNum._0_1_) {
LAB_00121c6e:
          plVar11 = &(local_1a8->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + 1;
        }
        if ((pSVar13 != (StringStorage *)0x0) && (local_110 == false)) {
          plVar11 = &(pSVar13->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar13);
          }
        }
      }
      local_170.ls = (ListStorage<MiniScript::String> *)0x0;
      local_170.isTemp = false;
      if (local_1b0.tempNum._0_1_ == 0) {
        local_180.ss = (StringStorage *)0x0;
        local_180.isTemp = false;
LAB_00123136:
        iVar10 = 0x19cab6;
        MiniScript::operator+
                  ((MiniScript *)&local_90,"import: library not found: ",(String *)&local_160);
        if (local_90 == (StringStorage *)0x0) {
          local_118 = (StringStorage *)0x0;
          local_110 = false;
          local_108 = 0;
          local_f8[0].tempNum._0_1_ = false;
          local_100 = (StringStorage *)0x0;
        }
        else {
          plVar11 = &(local_90->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + 1;
          local_120 = (undefined1  [8])&PTR__MiniscriptException_001bf360;
          local_118 = (StringStorage *)0x0;
          local_110 = false;
          local_108 = 0;
          local_f8[0].tempNum._0_1_ = false;
          local_100 = local_90;
          if (*plVar11 == 0) {
            (*(local_90->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
        }
        local_120 = (undefined1  [8])&PTR__MiniscriptException_001bf310;
        MiniScript::RuntimeException::raise((RuntimeException *)local_120,iVar10);
        local_120 = (undefined1  [8])&PTR__MiniscriptException_001bf360;
        if ((local_100 != (StringStorage *)0x0) && ((bool)local_f8[0]._0_1_ == false)) {
          plVar11 = &(local_100->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_100->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_100 = (StringStorage *)0x0;
        }
        if ((local_118 != (StringStorage *)0x0) && (local_110 == false)) {
          plVar11 = &(local_118->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_118->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_118 = (StringStorage *)0x0;
        }
        std::exception::~exception((exception *)local_120);
        if ((local_90 != (StringStorage *)0x0) && (local_88 == '\0')) {
          plVar11 = &(local_90->super_RefCountedStorage).refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_90->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_90 = (StringStorage *)0x0;
        }
      }
      else {
        MiniScript::Value::ToString((Value *)&local_248,(Machine *)&local_1b0);
        local_208 = Null;
        aVar15.ref = (RefCountedStorage *)operator_new(0x30);
        (aVar15.ref)->refCount = 1;
        (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
        aVar15.ref[1].refCount = 2;
        aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
        pp_Var16 = (_func_int **)operator_new__(2);
        aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
        *(undefined2 *)pp_Var16 = 0x3a;
        local_210.ref = aVar15.ref;
        MiniScript::Split((MiniScript *)local_120,(String *)&local_248,(String *)&local_210,-1);
        MiniScript::List<MiniScript::String>::operator=
                  (&local_170,(List<MiniScript::String> *)local_120);
        if ((local_120 != (undefined1  [8])0x0) && (local_118._0_1_ == false)) {
          plVar11 = &((RefCountedStorage *)local_120)->refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*((RefCountedStorage *)local_120)->_vptr_RefCountedStorage[1])();
            local_120 = (undefined1  [8])0x0;
          }
        }
        if ((local_210.ref != (RefCountedStorage *)0x0) && (local_208 == Null)) {
          plVar11 = &(local_210.ref)->refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_210.ref)->_vptr_RefCountedStorage[1])();
          }
        }
        if ((local_248.ref != (RefCountedStorage *)0x0) && (local_240.tempNum._0_1_ == '\0')) {
          plVar11 = &(local_248.ref)->refCount;
          *plVar11 = *plVar11 + -1;
          if (*plVar11 == 0) {
            (*(local_248.ref)->_vptr_RefCountedStorage[1])();
          }
        }
        local_180.ss = (StringStorage *)0x0;
        local_180.isTemp = false;
        if ((local_170.ls == (ListStorage<MiniScript::String> *)0x0) ||
           (local_40 = ((local_170.ls)->super_SimpleVector<MiniScript::String>).mQtyItems,
           (long)local_40 < 1)) goto LAB_00123136;
        local_58 = 0;
        uVar33 = 0;
        do {
          if (local_170.ls == (ListStorage<MiniScript::String> *)0x0) {
            MiniScript::_Error("Assert failed: ls",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/List.h"
                               ,0x3b);
          }
          pLVar7 = local_170.ls;
          if ((long)uVar33 <
              (long)((local_170.ls)->super_SimpleVector<MiniScript::String>).mQtyItems) {
            pSVar17 = ((local_170.ls)->super_SimpleVector<MiniScript::String>).mBuf + uVar33;
          }
          else {
            MiniScript::_Error("invalid index in SimpleVector::operator[]",
                               "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/SimpleVector.h"
                               ,0xc1);
            pSVar17 = (pLVar7->super_SimpleVector<MiniScript::String>).mBuf;
          }
          local_1c8[8] = false;
          pSVar13 = pSVar17->ss;
          local_1c8._0_8_ = pSVar13;
          local_38 = uVar33;
          if (pSVar13 == (StringStorage *)0x0) {
LAB_00121eab:
            pSVar13 = (StringStorage *)operator_new(0x30);
            (pSVar13->super_RefCountedStorage).refCount = 1;
            (pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage =
                 (_func_int **)&PTR__StringStorage_001bf0d8;
            pSVar13->dataSize = 2;
            pSVar13->charCount = -1;
            pcVar14 = (char *)operator_new__(2);
            pSVar13->data = pcVar14;
            pcVar14[0] = '.';
            pcVar14[1] = '\0';
            local_1c8[8] = false;
            local_1c8._0_8_ = pSVar13;
          }
          else {
            lVar3 = (pSVar13->super_RefCountedStorage).refCount;
            uVar27 = pSVar13->dataSize;
            (pSVar13->super_RefCountedStorage).refCount = lVar3 + 1;
            if (uVar27 < 2) {
              (pSVar13->super_RefCountedStorage).refCount = lVar3;
              if (lVar3 == 0) {
                (*(pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar13);
              }
              local_1c8._0_8_ = (StringStorage *)0x0;
              goto LAB_00121eab;
            }
            if (pSVar13->data[uVar27 - 2] != '/') {
              aVar15.ref = (RefCountedStorage *)operator_new(0x30);
              (aVar15.ref)->refCount = 1;
              (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
              aVar15.ref[1].refCount = 2;
              aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
              pp_Var16 = (_func_int **)operator_new__(2);
              aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
              *(undefined2 *)pp_Var16 = 0x2f;
              sVar4 = pSVar13->dataSize;
              local_200.ref = aVar15.ref;
              pSVar18 = (StringStorage *)operator_new(0x30);
              uVar27 = sVar4 + 1;
              (pSVar18->super_RefCountedStorage).refCount = 1;
              (pSVar18->super_RefCountedStorage)._vptr_RefCountedStorage =
                   (_func_int **)&PTR__StringStorage_001bf0d8;
              pSVar18->dataSize = uVar27;
              pSVar18->charCount = -1;
              pcVar14 = (char *)operator_new__(uVar27);
              local_218.ref = (RefCountedStorage *)(sVar4 - 1);
              pSVar18->data = pcVar14;
              memset(pcVar14,0,uVar27);
              memcpy(pcVar14,pSVar13->data,(size_t)local_218);
              *(undefined2 *)(pcVar14 + (sVar4 - 1)) = *(undefined2 *)pp_Var16;
              plVar11 = &(pSVar13->super_RefCountedStorage).refCount;
              *plVar11 = *plVar11 + -1;
              if (*plVar11 == 0) {
                (*(pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage[1])(pSVar13);
              }
              local_1c8[8] = false;
              plVar11 = &(local_200.ref)->refCount;
              *plVar11 = *plVar11 + -1;
              local_1c8._0_8_ = pSVar18;
              if (*plVar11 == 0) {
                (*(local_200.ref)->_vptr_RefCountedStorage[1])();
              }
            }
          }
          MiniScript::String::operator+((String *)local_120,(char *)&local_160.tempNum);
          auVar8 = local_120;
          if (local_120 != (undefined1  [8])0x0) {
            if ((StringStorage *)local_1c8._0_8_ == (StringStorage *)0x0) {
              MiniScript::String::operator=((String *)local_1c8,(String *)local_120);
            }
            else {
              local_200.ref = (RefCountedStorage *)local_1c8._0_8_;
              sVar4 = *(size_t *)(local_1c8._0_8_ + 0x18);
              pSVar17 = *(String **)((long)local_120 + 0x18);
              pSVar13 = (StringStorage *)operator_new(0x30);
              uVar27 = (long)pSVar17 + (sVar4 - 1);
              (pSVar13->super_RefCountedStorage).refCount = 1;
              (pSVar13->super_RefCountedStorage)._vptr_RefCountedStorage =
                   (_func_int **)&PTR__StringStorage_001bf0d8;
              pSVar13->dataSize = uVar27;
              pSVar13->charCount = -1;
              pcVar14 = (char *)operator_new__(uVar27);
              sVar31 = sVar4 - 1;
              pSVar13->data = pcVar14;
              memset(pcVar14,0,uVar27);
              aVar15 = local_200;
              memcpy(pcVar14,local_200.ref[1]._vptr_RefCountedStorage,sVar31);
              memcpy(pcVar14 + sVar31,
                     (void *)((SimpleVector<MiniScript::String> *)((long)auVar8 + 0x10))->
                             mBlockItems,(size_t)pSVar17);
              if ((bool)local_1c8[8] == false) {
                plVar11 = &(aVar15.ref)->refCount;
                *plVar11 = *plVar11 + -1;
                if (*plVar11 == 0) {
                  (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
                }
              }
              local_1c8[8] = false;
              local_1c8._0_8_ = pSVar13;
            }
            if ((local_120 != (undefined1  [8])0x0) && (local_118._0_1_ == false)) {
              plVar11 = &((RefCountedStorage *)local_120)->refCount;
              *plVar11 = *plVar11 + -1;
              if (*plVar11 == 0) {
                (*((RefCountedStorage *)local_120)->_vptr_RefCountedStorage[1])();
              }
            }
          }
          local_1d8[8] = '\0';
          local_1d8._0_8_ = local_1c8._0_8_;
          if ((StringStorage *)local_1c8._0_8_ == (StringStorage *)0x0) {
            local_200.number = 0.0;
          }
          else {
            plVar11 = &((RefCountedStorage *)local_1c8._0_8_)->refCount;
            *plVar11 = *plVar11 + 1;
            local_200.ref = (RefCountedStorage *)(*(size_t *)(local_1c8._0_8_ + 0x18) - 1);
          }
          getEnvMap();
LAB_0012216f:
          uVar33 = local_38;
          uVar6 = local_1d8._0_8_;
          if ((StringStorage *)local_1d8._0_8_ == (StringStorage *)0x0) {
            local_1a0.ss = (StringStorage *)0x0;
          }
          else {
            pRVar5 = *(RefCountedStorage **)(local_1d8._0_8_ + 0x18);
            puVar32 = (undefined1 *)((long)&pRVar5[-1].refCount + 5);
            if (-1 < (long)puVar32) {
              pcVar14 = *(char **)(local_1d8._0_8_ + 0x10);
              puVar28 = (undefined1 *)((long)&pRVar5[-1].refCount + 6);
              puVar24 = (undefined1 *)0x0;
              do {
                if ((pcVar14[(long)puVar24] == '$') && (pcVar14[(long)(puVar24 + 1)] == '{')) {
                  sVar31 = 0xfffffffffffffffe;
                  puVar30 = puVar24;
                  goto LAB_001222dd;
                }
                puVar24 = puVar24 + 1;
              } while (puVar28 != puVar24);
LAB_001221ad:
              puVar24 = (undefined1 *)0x0;
              do {
                if ((pcVar14[(long)puVar24] == '$') && (pcVar14[(long)(puVar24 + 1)] == '(')) {
                  sVar31 = 0xfffffffffffffffe;
                  puVar28 = puVar24;
                  goto LAB_0012253f;
                }
                puVar24 = puVar24 + 1;
              } while (puVar28 != puVar24);
            }
LAB_001221ce:
            if (-1 < (long)((long)&pRVar5[-1].refCount + 6)) {
              pRVar25 = (RefCountedStorage *)0x0;
              while (*(char *)((long)&pRVar25->_vptr_RefCountedStorage +
                              (long)*(char **)(local_1d8._0_8_ + 0x10)) != '$') {
                pRVar25 = (RefCountedStorage *)((long)&pRVar25->_vptr_RefCountedStorage + 1);
                if ((RefCountedStorage *)((long)&pRVar5[-1].refCount + 7) == pRVar25)
                goto LAB_00122f90;
              }
              aVar15.ref = (RefCountedStorage *)((long)&pRVar25->_vptr_RefCountedStorage + 1);
              aVar20.ref = aVar15.ref;
              local_230.ref = aVar15.ref;
              while (((((long)aVar20.ref < (long)local_200.ref &&
                       (bVar2 = (*(char **)(local_1d8._0_8_ + 0x10))[(long)aVar20.ref],
                       local_230 = aVar20, '/' < (char)bVar2)) && (6 < (byte)(bVar2 - 0x3a))) &&
                     ((0x24 < bVar2 - 0x5b ||
                      ((0x1f0000002fU >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) == 0))))) {
                aVar20.ref = (RefCountedStorage *)((long)&(aVar20.ref)->_vptr_RefCountedStorage + 1)
                ;
                local_230 = local_200;
              }
              if ((ulong)aVar15 < pRVar5) {
                sVar31 = (long)&(local_230.ref)->_vptr_RefCountedStorage + ~(ulong)pRVar25;
                sVar19 = (long)pRVar5 + (-2 - (long)pRVar25);
                if ((long)sVar19 < (long)sVar31) {
                  sVar31 = sVar19;
                }
                if (local_230.ref == pRVar25) {
                  sVar31 = sVar19;
                }
                aVar15.ref = (RefCountedStorage *)operator_new(0x30);
                uVar27 = sVar31 + 1;
                (aVar15.ref)->refCount = 1;
                (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
                aVar15.ref[1].refCount = uVar27;
                aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
                pp_Var16 = (_func_int **)operator_new__(uVar27);
                aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
                memset(pp_Var16,0,uVar27);
                memcpy(pp_Var16,(char *)((long)&pRVar25->_vptr_RefCountedStorage +
                                        (long)(*(char **)(uVar6 + 0x10) + 1)),sVar31);
              }
              else {
                aVar15.number = 0.0;
              }
              local_218 = aVar15;
              MiniScript::String::Substring((String *)&local_210,(long)local_1d8,0);
              pSVar13 = local_118;
              local_1f8.type = String;
              local_1f8.noInvoke = false;
              local_1f8.localOnly = Off;
              local_1f8.data = aVar15;
              if (aVar15.ref == (RefCountedStorage *)0x0) {
                local_1f8.data = DAT_001c1308;
              }
              if (local_1f8.data.ref != (RefCountedStorage *)0x0) {
                (local_1f8.data.ref)->refCount = (local_1f8.data.ref)->refCount + 1;
              }
              if (local_118 == (StringStorage *)0x0) {
LAB_00122445:
                local_228._1_2_ = _DAT_001c1301;
                local_220 = DAT_001c1308;
                local_228[0] = MiniScript::Value::emptyString;
              }
              else {
                uVar9 = MiniScript::HashValue(&local_1f8);
                psVar26 = &pSVar13->dataSize + uVar9 % 0xfb;
                do {
                  psVar26 = (size_t *)*psVar26;
                  if (psVar26 == (size_t *)0x0) goto LAB_00122445;
                  bVar35 = MiniScript::Value::operator==((Value *)(psVar26 + 1),&local_1f8);
                } while (!bVar35);
                local_228._1_2_ = *(undefined2 *)((long)psVar26 + 0x19);
                local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar26 + 4))->ref;
                local_228[0] = *(byte *)(psVar26 + 3);
              }
              if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
                (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
              }
              MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
              aVar15 = local_1e8;
              if (local_1e8.ref == (RefCountedStorage *)0x0) {
                aVar20 = local_210;
                if (local_210.ref != (RefCountedStorage *)0x0) goto LAB_001225f6;
                aVar20.number = 0.0;
              }
              else {
                aVar20 = local_1e8;
                if (local_210.ref == (RefCountedStorage *)0x0) {
LAB_001225f6:
                  (aVar20.ref)->refCount = (aVar20.ref)->refCount + 1;
                }
                else {
                  local_238.number = local_210.number;
                  lVar3 = local_210.ref[1].refCount;
                  sVar31 = local_1e8.ref[1].refCount;
                  aVar20.ref = (RefCountedStorage *)operator_new(0x30);
                  uVar27 = (lVar3 + sVar31) - 1;
                  (aVar20.ref)->refCount = 1;
                  (aVar20.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8
                  ;
                  aVar20.ref[1].refCount = uVar27;
                  aVar20.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
                  pp_Var16 = (_func_int **)operator_new__(uVar27);
                  sVar19 = lVar3 - 1;
                  aVar20.ref[1]._vptr_RefCountedStorage = pp_Var16;
                  memset(pp_Var16,0,uVar27);
                  memcpy(pp_Var16,local_238.ref[1]._vptr_RefCountedStorage,sVar19);
                  memcpy((void *)(sVar19 + (long)pp_Var16),aVar15.ref[1]._vptr_RefCountedStorage,
                         sVar31);
                }
              }
              uVar6 = local_1d8._0_8_;
              if ((StringStorage *)local_1d8._0_8_ == (StringStorage *)0x0) {
LAB_00122746:
                local_240.number = local_240.number & 0xffffffffffffff00;
                bVar35 = true;
                if (aVar20.ref != (RefCountedStorage *)0x0) {
                  (aVar20.ref)->refCount = (aVar20.ref)->refCount + 1;
                }
                aVar15.number = 0.0;
                local_248 = aVar20;
              }
              else {
                pRVar5 = *(RefCountedStorage **)(local_1d8._0_8_ + 0x18);
                pp_Var16 = (_func_int **)((long)pRVar5 - (long)local_230);
                if (pRVar5 < local_230.ref || pp_Var16 == (_func_int **)0x0) goto LAB_00122746;
                aVar15.ref = (RefCountedStorage *)operator_new(0x30);
                (aVar15.ref)->refCount = 1;
                (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
                aVar15.ref[1].refCount = (long)pp_Var16;
                aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
                __s.ref = (RefCountedStorage *)operator_new__((ulong)pp_Var16);
                aVar21 = local_230;
                uVar27 = ~(ulong)local_230.ref;
                ((anon_union_8_3_2f476f46_for_data *)(aVar15.ref + 1))->ref =
                     (RefCountedStorage *)__s;
                local_1b8 = pp_Var16;
                memset(__s.ref,0,(size_t)pp_Var16);
                local_230.ref = __s.ref;
                memcpy(__s.ref,*(char **)(uVar6 + 0x10) +
                               (long)&(aVar21.ref)->_vptr_RefCountedStorage,
                       (long)&pRVar5->_vptr_RefCountedStorage + uVar27);
                if (aVar20.ref == (RefCountedStorage *)0x0) {
                  local_240.number = local_240.number & 0xffffffffffffff00;
                  (aVar15.ref)->refCount = 2;
                  bVar35 = false;
                  local_248.ref = aVar15.ref;
                }
                else {
                  lVar3 = aVar20.ref[1].refCount;
                  local_238 = aVar20;
                  local_190.ref = aVar15.ref;
                  aVar21.ref = (RefCountedStorage *)operator_new(0x30);
                  pp_Var16 = local_1b8;
                  uVar27 = (long)local_1b8 + lVar3 + -1;
                  (aVar21.ref)->refCount = 1;
                  (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8
                  ;
                  aVar21.ref[1].refCount = uVar27;
                  aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
                  __s_00 = (_func_int **)operator_new__(uVar27);
                  sVar31 = lVar3 - 1;
                  aVar21.ref[1]._vptr_RefCountedStorage = __s_00;
                  bVar35 = false;
                  memset(__s_00,0,uVar27);
                  aVar20 = local_238;
                  memcpy(__s_00,local_238.ref[1]._vptr_RefCountedStorage,sVar31);
                  memcpy((void *)(sVar31 + (long)__s_00),local_230.ref,(size_t)pp_Var16);
                  local_240.number = local_240.number & 0xffffffffffffff00;
                  aVar15 = local_190;
                  local_248.ref = aVar21.ref;
                }
              }
              MiniScript::String::operator=((String *)local_1d8,(String *)&local_248);
              if ((local_248.ref != (RefCountedStorage *)0x0) && (local_240.tempNum._0_1_ == '\0'))
              {
                plVar11 = &(local_248.ref)->refCount;
                *plVar11 = *plVar11 + -1;
                if (*plVar11 == 0) {
                  (*(local_248.ref)->_vptr_RefCountedStorage[1])();
                }
                local_248.number = 0.0;
              }
              if (!bVar35) {
                plVar11 = &(aVar15.ref)->refCount;
                *plVar11 = *plVar11 + -1;
                if (*plVar11 == 0) {
                  (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
                }
              }
              aVar15 = local_218;
              if (aVar20.ref != (RefCountedStorage *)0x0) {
                plVar11 = &(aVar20.ref)->refCount;
                *plVar11 = *plVar11 + -1;
                if (*plVar11 == 0) {
                  (*(aVar20.ref)->_vptr_RefCountedStorage[1])(aVar20.number);
                  aVar15 = local_218;
                }
              }
              goto joined_r0x00122eb5;
            }
LAB_00122f90:
            local_1a0.ss = (StringStorage *)local_1d8._0_8_;
            plVar11 = &((RefCountedStorage *)local_1d8._0_8_)->refCount;
            *plVar11 = *plVar11 + 1;
          }
          local_1a0.isTemp = false;
          if ((local_118 != (StringStorage *)0x0) && (local_110 == false)) {
            plVar11 = &(local_118->super_RefCountedStorage).refCount;
            *plVar11 = *plVar11 + -1;
            if (*plVar11 == 0) {
              (*(local_118->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            }
          }
          MiniScript::String::operator=((String *)local_1c8,&local_1a0);
          if ((local_1a0.ss != (StringStorage *)0x0) && (local_1a0.isTemp == false)) {
            plVar11 = &((local_1a0.ss)->super_RefCountedStorage).refCount;
            *plVar11 = *plVar11 + -1;
            if (*plVar11 == 0) {
              (*((local_1a0.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
            }
            local_1a0.ss = (StringStorage *)0x0;
          }
          if (((StringStorage *)local_1d8._0_8_ != (StringStorage *)0x0) && (local_1d8[8] == '\0'))
          {
            plVar11 = &((RefCountedStorage *)local_1d8._0_8_)->refCount;
            *plVar11 = *plVar11 + -1;
            if (*plVar11 == 0) {
              (*((RefCountedStorage *)local_1d8._0_8_)->_vptr_RefCountedStorage[1])();
            }
            local_1d8._0_8_ = (StringStorage *)0x0;
          }
          pcVar14 = "";
          if ((StringStorage *)local_1c8._0_8_ != (StringStorage *)0x0) {
            pcVar14 = *(char **)(local_1c8._0_8_ + 0x10);
          }
          __stream = fopen(pcVar14,"r");
          if (__stream != (FILE *)0x0) {
            ReadFileHelper((FILE *)local_120,(long)__stream);
            MiniScript::String::operator=(&local_180,(String *)local_120);
            if ((local_120 != (undefined1  [8])0x0) && (local_118._0_1_ == false)) {
              plVar11 = &((RefCountedStorage *)local_120)->refCount;
              *plVar11 = *plVar11 + -1;
              if (*plVar11 == 0) {
                (*((RefCountedStorage *)local_120)->_vptr_RefCountedStorage[1])();
              }
            }
            iVar10 = fclose(__stream);
            local_58 = CONCAT71((int7)(CONCAT44(extraout_var,iVar10) >> 8),1);
          }
          if (((StringStorage *)local_1c8._0_8_ != (StringStorage *)0x0) &&
             ((bool)local_1c8[8] == false)) {
            plVar11 = &((RefCountedStorage *)local_1c8._0_8_)->refCount;
            *plVar11 = *plVar11 + -1;
            if (*plVar11 == 0) {
              (*((RefCountedStorage *)local_1c8._0_8_)->_vptr_RefCountedStorage[1])();
            }
          }
        } while ((__stream == (FILE *)0x0) && (uVar33 = uVar33 + 1, uVar33 != local_40));
        if ((local_58 & 1) == 0) goto LAB_00123136;
      }
      MiniScript::Parser::Parser((Parser *)local_120);
      MiniScript::String::operator+((String *)&local_248,(char *)&local_160.tempNum);
      MiniScript::String::operator=((String *)local_120,(String *)&local_248);
      if ((local_248.ref != (RefCountedStorage *)0x0) && (local_240.tempNum._0_1_ == '\0')) {
        plVar11 = &(local_248.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_248.ref)->_vptr_RefCountedStorage[1])();
        }
      }
      local_140.isTemp = false;
      local_140.ss = local_180.ss;
      if (local_180.ss != (StringStorage *)0x0) {
        plVar11 = &((local_180.ss)->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + 1;
      }
      MiniScript::Parser::Parse((Parser *)local_120,&local_140,false);
      if ((local_140.ss != (StringStorage *)0x0) && (local_140.isTemp == false)) {
        plVar11 = &((local_140.ss)->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((local_140.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_140.ss = (StringStorage *)0x0;
      }
      func = MiniScript::Parser::CreateImport((Parser *)local_120);
      local_50.type = Temp;
      local_50.noInvoke = false;
      local_50.localOnly = Off;
      local_50.data.ref = (RefCountedStorage *)((ulong)(uint)local_50.data._4_4_ << 0x20);
      MiniScript::Machine::ManuallyPushCall((Machine *)local_188[7].ss,func,&local_50);
      if ((Temp < local_50.type) && (local_50.data.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_50.data.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_50.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_50.data.number = 0.0;
      }
      pCVar34 = local_60;
      local_150.type = String;
      local_150.noInvoke = false;
      local_150.localOnly = Off;
      local_150.data = local_160;
      if (local_160.ref == (RefCountedStorage *)0x0) {
        local_150.data = DAT_001c1308;
      }
      if (local_150.data.ref != (RefCountedStorage *)0x0) {
        (local_150.data.ref)->refCount = (local_150.data.ref)->refCount + 1;
      }
      ((RefCountedStorage *)&local_60->code)->_vptr_RefCountedStorage = (_func_int **)0x0;
      MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)local_60);
      MiniScript::Value::operator=
                ((Value *)(((RefCountedStorage *)&pCVar34->code)->_vptr_RefCountedStorage + 3),
                 &local_150);
      *(undefined1 *)(((RefCountedStorage *)&pCVar34->code)->_vptr_RefCountedStorage + 2) = 0;
      if ((Temp < local_150.type) && (local_150.data.ref != (RefCountedStorage *)0x0)) {
        plVar11 = &(local_150.data.ref)->refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_150.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_150.data.number = 0.0;
      }
      MiniScript::Parser::~Parser((Parser *)local_120);
      if ((local_180.ss != (StringStorage *)0x0) && (local_180.isTemp == false)) {
        plVar11 = &((local_180.ss)->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((local_180.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
      }
      if ((local_170.ls != (ListStorage<MiniScript::String> *)0x0) && (local_170.isTemp == false)) {
        plVar11 = &((local_170.ls)->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*((local_170.ls)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
      }
      if ((2 < (byte)local_1b0.tempNum._0_1_) &&
         (local_1a8 != (ListStorage<MiniScript::Context_*> *)0x0)) {
        plVar11 = &(local_1a8->super_RefCountedStorage).refCount;
        *plVar11 = *plVar11 + -1;
        if (*plVar11 == 0) {
          (*(local_1a8->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
      }
      if (local_160.ref == (RefCountedStorage *)0x0) {
        return (IntrinsicResult)(IntrinsicResultStorage *)pCVar34;
      }
      if (local_158 != '\0') {
        return (IntrinsicResult)(IntrinsicResultStorage *)pCVar34;
      }
      goto LAB_001234ee;
    }
  }
  MiniScript::Context::GetTemp((Context *)&local_248,(int)local_188);
  if (*in_RDX == 0) {
    pbVar22 = &MiniScript::Value::null;
  }
  else {
    pbVar22 = (byte *)(*in_RDX + 0x18);
  }
  local_120._0_3_ = *(undefined3 *)pbVar22;
  local_118 = *(StringStorage **)(pbVar22 + 8);
  if (local_118 != (StringStorage *)0x0 && 2 < *pbVar22) {
    plVar11 = &(local_118->super_RefCountedStorage).refCount;
    *plVar11 = *plVar11 + 1;
  }
  MiniScript::Value::ToString((Value *)&local_210,(Machine *)local_120);
  if ((2 < (byte)local_120[0]) && (local_118 != (StringStorage *)0x0)) {
    plVar11 = &(local_118->super_RefCountedStorage).refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_118->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  aVar15 = local_248;
  pCVar34 = *(Context **)&local_188[5].isTemp;
  local_78 = '\0';
  local_80.number = local_210.number;
  if (local_210.ref != (RefCountedStorage *)0x0) {
    (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
  }
  local_130.type = local_248.tempNum._0_1_;
  local_130.noInvoke = (bool)local_248.tempNum._1_1_;
  local_130.localOnly = local_248.tempNum._2_1_;
  local_130.data.number = local_240.number;
  if (local_240.ref != (RefCountedStorage *)0x0 && 2 < (byte)local_248.tempNum._0_1_) {
    (local_240.ref)->refCount = (local_240.ref)->refCount + 1;
  }
  local_248 = aVar15;
  MiniScript::Context::SetVar(pCVar34,(String *)&local_80,&local_130);
  if ((Temp < local_130.type) && (local_130.data.ref != (RefCountedStorage *)0x0)) {
    plVar11 = &(local_130.data.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_130.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_130.data.number = 0.0;
  }
  if ((local_80.ref != (RefCountedStorage *)0x0) && (local_78 == '\0')) {
    plVar11 = &(local_80.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
    }
    local_80.number = 0.0;
  }
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)&MiniScript::IntrinsicResult::Null);
  pCVar34 = local_60;
  pp_Var16 = MiniScript::IntrinsicResult::Null;
  ((RefCountedStorage *)&local_60->code)->_vptr_RefCountedStorage =
       MiniScript::IntrinsicResult::Null;
  if (pp_Var16 != (_func_int **)0x0) {
    pp_Var16 = pp_Var16 + 1;
    *pp_Var16 = *pp_Var16 + 1;
  }
  if ((local_210.ref != (RefCountedStorage *)0x0) && (local_208 == Null)) {
    plVar11 = &(local_210.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_210.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((byte)local_248.tempNum._0_1_ < 3) {
    return (IntrinsicResult)(IntrinsicResultStorage *)pCVar34;
  }
  local_160 = local_240;
  if (local_240.ref == (RefCountedStorage *)0x0) {
    return (IntrinsicResult)(IntrinsicResultStorage *)pCVar34;
  }
LAB_001234ee:
  plVar11 = &(local_160.ref)->refCount;
  *plVar11 = *plVar11 + -1;
  if (*plVar11 == 0) {
    (*(local_160.ref)->_vptr_RefCountedStorage[1])();
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)pCVar34;
  while (sVar31 = sVar31 + 1, pcVar14[(long)(puVar29 + 1)] != '}') {
LAB_001222dd:
    puVar29 = puVar30;
    puVar30 = puVar29 + 1;
    if ((long)local_200.ref <= (long)puVar30) goto LAB_001221ad;
  }
  if ((RefCountedStorage *)(puVar24 + 2) < pRVar5) {
    sVar23 = (long)pRVar5 + (-3 - (long)puVar24);
    sVar19 = sVar31;
    if ((long)sVar23 < (long)sVar31) {
      sVar19 = sVar23;
    }
    if (sVar31 == 0xffffffffffffffff) {
      sVar19 = sVar23;
    }
    aVar15.ref = (RefCountedStorage *)operator_new(0x30);
    local_230.ref = (RefCountedStorage *)(sVar19 + 1);
    (aVar15.ref)->refCount = 1;
    (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar15.ref[1].refCount = (long)local_230;
    aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var16 = (_func_int **)operator_new__((ulong)local_230);
    aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
    local_218.ref = aVar15.ref;
    memset(pp_Var16,0,(size_t)local_230);
    memcpy(pp_Var16,*(char **)(uVar6 + 0x10) + (long)(puVar24 + 2),sVar19);
  }
  else {
    local_218.number = 0.0;
  }
  MiniScript::String::Substring((String *)&local_210,(long)local_1d8,0);
  pSVar13 = local_118;
  local_1f8.type = String;
  local_1f8.noInvoke = false;
  local_1f8.localOnly = Off;
  local_1f8.data = local_218;
  if (local_218.ref == (RefCountedStorage *)0x0) {
    local_1f8.data = DAT_001c1308;
  }
  if (local_1f8.data.ref != (RefCountedStorage *)0x0) {
    (local_1f8.data.ref)->refCount = (local_1f8.data.ref)->refCount + 1;
  }
  if (local_118 == (StringStorage *)0x0) {
LAB_0012288a:
    local_228._1_2_ = _DAT_001c1301;
    local_220 = DAT_001c1308;
    local_228[0] = MiniScript::Value::emptyString;
  }
  else {
    uVar9 = MiniScript::HashValue(&local_1f8);
    psVar26 = &pSVar13->dataSize + uVar9 % 0xfb;
    do {
      psVar26 = (size_t *)*psVar26;
      if (psVar26 == (size_t *)0x0) goto LAB_0012288a;
      bVar35 = MiniScript::Value::operator==((Value *)(psVar26 + 1),&local_1f8);
    } while (!bVar35);
    local_228._1_2_ = *(undefined2 *)((long)psVar26 + 0x19);
    local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar26 + 4))->ref;
    local_228[0] = *(byte *)(psVar26 + 3);
  }
  if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
    (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
  }
  MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
  aVar15 = local_1e8;
  if (local_1e8.ref == (RefCountedStorage *)0x0) {
    if (local_210.ref == (RefCountedStorage *)0x0) {
      aVar20.number = 0.0;
    }
    else {
      (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
      aVar20 = local_210;
    }
  }
  else if (local_210.ref == (RefCountedStorage *)0x0) {
    (local_1e8.ref)->refCount = (local_1e8.ref)->refCount + 1;
    aVar20 = local_1e8;
  }
  else {
    local_230.number = local_210.number;
    lVar3 = local_210.ref[1].refCount;
    aVar21 = (anon_union_8_3_2f476f46_for_data)local_1e8.ref[1].refCount;
    aVar20.ref = (RefCountedStorage *)operator_new(0x30);
    uVar27 = (long)aVar21.ref + lVar3 + -1;
    (aVar20.ref)->refCount = 1;
    (aVar20.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar20.ref[1].refCount = uVar27;
    aVar20.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    local_238 = aVar21;
    pp_Var16 = (_func_int **)operator_new__(uVar27);
    sVar31 = lVar3 - 1;
    aVar20.ref[1]._vptr_RefCountedStorage = pp_Var16;
    memset(pp_Var16,0,uVar27);
    memcpy(pp_Var16,local_230.ref[1]._vptr_RefCountedStorage,sVar31);
    memcpy((void *)(sVar31 + (long)pp_Var16),aVar15.ref[1]._vptr_RefCountedStorage,(size_t)local_238
          );
  }
  uVar6 = local_1d8._0_8_;
  if (((StringStorage *)local_1d8._0_8_ == (StringStorage *)0x0) ||
     (puVar32 = *(undefined1 **)(local_1d8._0_8_ + 0x18), puVar32 <= puVar29 + 2)) {
    local_240.number = local_240.number & 0xffffffffffffff00;
    bVar35 = true;
    if (aVar20.ref != (RefCountedStorage *)0x0) {
      (aVar20.ref)->refCount = (aVar20.ref)->refCount + 1;
    }
    aVar15.number = 0.0;
    local_248 = aVar20;
  }
  else {
    local_238.ref = (RefCountedStorage *)operator_new(0x30);
    puVar28 = puVar32 + ~(ulong)puVar30;
    (local_238.ref)->refCount = 1;
    (local_238.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    local_238.ref[1].refCount = (long)puVar28;
    local_238.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    local_1b8 = (_func_int **)operator_new__((ulong)puVar28);
    local_238.ref[1]._vptr_RefCountedStorage = local_1b8;
    memset(local_1b8,0,(size_t)puVar28);
    memcpy(local_1b8,*(char **)(uVar6 + 0x10) + (long)(puVar29 + 2),
           (size_t)(puVar32 + (-2 - (long)puVar30)));
    if (aVar20.ref == (RefCountedStorage *)0x0) {
      local_240.number = local_240.number & 0xffffffffffffff00;
      local_248.number = local_238.number;
      (local_238.ref)->refCount = 2;
      bVar35 = false;
      aVar15 = local_238;
    }
    else {
      lVar3 = aVar20.ref[1].refCount;
      local_230 = aVar20;
      aVar21.ref = (RefCountedStorage *)operator_new(0x30);
      puVar32 = puVar32 + (-2 - (long)puVar30) + lVar3;
      (aVar21.ref)->refCount = 1;
      (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar21.ref[1].refCount = (long)puVar32;
      aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      pp_Var16 = (_func_int **)operator_new__((ulong)puVar32);
      sVar31 = lVar3 - 1;
      aVar21.ref[1]._vptr_RefCountedStorage = pp_Var16;
      bVar35 = false;
      memset(pp_Var16,0,(size_t)puVar32);
      aVar20 = local_230;
      memcpy(pp_Var16,local_230.ref[1]._vptr_RefCountedStorage,sVar31);
      memcpy((void *)(sVar31 + (long)pp_Var16),local_1b8,(size_t)puVar28);
      local_240.number = local_240.number & 0xffffffffffffff00;
      aVar15 = local_238;
      local_248.ref = aVar21.ref;
    }
  }
  MiniScript::String::operator=((String *)local_1d8,(String *)&local_248);
  goto LAB_00122e5c;
  while (sVar31 = sVar31 + 1, pcVar14[(long)(puVar30 + 1)] != ')') {
LAB_0012253f:
    puVar30 = puVar28;
    puVar28 = puVar30 + 1;
    if ((long)local_200.ref <= (long)puVar28) goto LAB_001221ce;
  }
  if ((RefCountedStorage *)(puVar24 + 2) < pRVar5) {
    sVar23 = (long)puVar32 - (long)puVar24;
    sVar19 = sVar31;
    if ((long)sVar23 < (long)sVar31) {
      sVar19 = sVar23;
    }
    if (sVar31 == 0xffffffffffffffff) {
      sVar19 = sVar23;
    }
    aVar15.ref = (RefCountedStorage *)operator_new(0x30);
    local_230.ref = (RefCountedStorage *)(sVar19 + 1);
    (aVar15.ref)->refCount = 1;
    (aVar15.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar15.ref[1].refCount = (long)local_230;
    aVar15.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    pp_Var16 = (_func_int **)operator_new__((ulong)local_230);
    aVar15.ref[1]._vptr_RefCountedStorage = pp_Var16;
    local_218.ref = aVar15.ref;
    memset(pp_Var16,0,(size_t)local_230);
    memcpy(pp_Var16,*(char **)(uVar6 + 0x10) + (long)(puVar24 + 2),sVar19);
  }
  else {
    local_218.number = 0.0;
  }
  MiniScript::String::Substring((String *)&local_210,(long)local_1d8,0);
  pSVar13 = local_118;
  local_1f8.type = String;
  local_1f8.noInvoke = false;
  local_1f8.localOnly = Off;
  local_1f8.data = local_218;
  if (local_218.ref == (RefCountedStorage *)0x0) {
    local_1f8.data = DAT_001c1308;
  }
  if (local_1f8.data.ref != (RefCountedStorage *)0x0) {
    (local_1f8.data.ref)->refCount = (local_1f8.data.ref)->refCount + 1;
  }
  if (local_118 == (StringStorage *)0x0) {
LAB_00122a50:
    local_228._1_2_ = _DAT_001c1301;
    local_220 = DAT_001c1308;
    local_228[0] = MiniScript::Value::emptyString;
  }
  else {
    uVar9 = MiniScript::HashValue(&local_1f8);
    psVar26 = &pSVar13->dataSize + uVar9 % 0xfb;
    do {
      psVar26 = (size_t *)*psVar26;
      if (psVar26 == (size_t *)0x0) goto LAB_00122a50;
      bVar35 = MiniScript::Value::operator==((Value *)(psVar26 + 1),&local_1f8);
    } while (!bVar35);
    local_228._1_2_ = *(undefined2 *)((long)psVar26 + 0x19);
    local_220.ref = ((anon_union_8_3_2f476f46_for_data *)(psVar26 + 4))->ref;
    local_228[0] = *(byte *)(psVar26 + 3);
  }
  if (local_220.ref != (RefCountedStorage *)0x0 && 2 < local_228[0]) {
    (local_220.ref)->refCount = (local_220.ref)->refCount + 1;
  }
  MiniScript::Value::ToString((Value *)&local_1e8,(Machine *)local_228);
  aVar15 = local_1e8;
  if (local_1e8.ref == (RefCountedStorage *)0x0) {
    if (local_210.ref == (RefCountedStorage *)0x0) {
      aVar20.number = 0.0;
    }
    else {
      (local_210.ref)->refCount = (local_210.ref)->refCount + 1;
      aVar20 = local_210;
    }
  }
  else if (local_210.ref == (RefCountedStorage *)0x0) {
    (local_1e8.ref)->refCount = (local_1e8.ref)->refCount + 1;
    aVar20 = local_1e8;
  }
  else {
    local_230.number = local_210.number;
    lVar3 = local_210.ref[1].refCount;
    aVar21 = (anon_union_8_3_2f476f46_for_data)local_1e8.ref[1].refCount;
    aVar20.ref = (RefCountedStorage *)operator_new(0x30);
    uVar27 = (long)aVar21.ref + lVar3 + -1;
    (aVar20.ref)->refCount = 1;
    (aVar20.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    aVar20.ref[1].refCount = uVar27;
    aVar20.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    local_238 = aVar21;
    pp_Var16 = (_func_int **)operator_new__(uVar27);
    sVar31 = lVar3 - 1;
    aVar20.ref[1]._vptr_RefCountedStorage = pp_Var16;
    memset(pp_Var16,0,uVar27);
    memcpy(pp_Var16,local_230.ref[1]._vptr_RefCountedStorage,sVar31);
    memcpy((void *)(sVar31 + (long)pp_Var16),aVar15.ref[1]._vptr_RefCountedStorage,(size_t)local_238
          );
  }
  uVar6 = local_1d8._0_8_;
  if (((StringStorage *)local_1d8._0_8_ == (StringStorage *)0x0) ||
     (puVar32 = *(undefined1 **)(local_1d8._0_8_ + 0x18), puVar32 <= puVar30 + 2)) {
    local_240.number = local_240.number & 0xffffffffffffff00;
    bVar35 = true;
    if (aVar20.ref != (RefCountedStorage *)0x0) {
      (aVar20.ref)->refCount = (aVar20.ref)->refCount + 1;
    }
    aVar15.number = 0.0;
    local_248 = aVar20;
  }
  else {
    local_238.ref = (RefCountedStorage *)operator_new(0x30);
    puVar24 = puVar32 + ~(ulong)puVar28;
    (local_238.ref)->refCount = 1;
    (local_238.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
    local_238.ref[1].refCount = (long)puVar24;
    local_238.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
    local_1b8 = (_func_int **)operator_new__((ulong)puVar24);
    local_238.ref[1]._vptr_RefCountedStorage = local_1b8;
    memset(local_1b8,0,(size_t)puVar24);
    memcpy(local_1b8,*(char **)(uVar6 + 0x10) + (long)(puVar30 + 2),
           (size_t)(puVar32 + (-2 - (long)puVar28)));
    if (aVar20.ref == (RefCountedStorage *)0x0) {
      local_240.number = local_240.number & 0xffffffffffffff00;
      local_248.number = local_238.number;
      (local_238.ref)->refCount = 2;
      bVar35 = false;
      aVar15 = local_238;
    }
    else {
      lVar3 = aVar20.ref[1].refCount;
      local_230 = aVar20;
      aVar21.ref = (RefCountedStorage *)operator_new(0x30);
      puVar32 = puVar32 + (-2 - (long)puVar28) + lVar3;
      (aVar21.ref)->refCount = 1;
      (aVar21.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__StringStorage_001bf0d8;
      aVar21.ref[1].refCount = (long)puVar32;
      aVar21.ref[2]._vptr_RefCountedStorage = (_func_int **)0xffffffffffffffff;
      pp_Var16 = (_func_int **)operator_new__((ulong)puVar32);
      sVar31 = lVar3 - 1;
      aVar21.ref[1]._vptr_RefCountedStorage = pp_Var16;
      bVar35 = false;
      memset(pp_Var16,0,(size_t)puVar32);
      aVar20 = local_230;
      memcpy(pp_Var16,local_230.ref[1]._vptr_RefCountedStorage,sVar31);
      memcpy((void *)(sVar31 + (long)pp_Var16),local_1b8,(size_t)puVar24);
      local_240.number = local_240.number & 0xffffffffffffff00;
      aVar15 = local_238;
      local_248.ref = aVar21.ref;
    }
  }
  MiniScript::String::operator=((String *)local_1d8,(String *)&local_248);
LAB_00122e5c:
  if ((local_248.ref != (RefCountedStorage *)0x0) && (local_240.tempNum._0_1_ == '\0')) {
    plVar11 = &(local_248.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_248.ref)->_vptr_RefCountedStorage[1])();
    }
    local_248.number = 0.0;
  }
  if (!bVar35) {
    plVar11 = &(aVar15.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
    }
  }
  aVar15 = local_218;
  if (aVar20.ref != (RefCountedStorage *)0x0) {
    plVar11 = &(aVar20.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(aVar20.ref)->_vptr_RefCountedStorage[1])(aVar20.number);
    }
  }
joined_r0x00122eb5:
  if ((local_1e8.ref != (RefCountedStorage *)0x0) && (local_1e0.tempNum._0_1_ == '\0')) {
    plVar11 = &(local_1e8.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_1e8.ref)->_vptr_RefCountedStorage[1])();
    }
    local_1e8.number = 0.0;
  }
  if ((2 < local_228[0]) && (local_220.ref != (RefCountedStorage *)0x0)) {
    plVar11 = &(local_220.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_220.ref)->_vptr_RefCountedStorage[1])();
    }
    local_220.number = 0.0;
  }
  if ((Temp < local_1f8.type) && (local_1f8.data.ref != (RefCountedStorage *)0x0)) {
    plVar11 = &(local_1f8.data.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_1f8.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if ((local_210.ref != (RefCountedStorage *)0x0) && (local_208 == Null)) {
    plVar11 = &(local_210.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(local_210.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  if (aVar15.ref != (RefCountedStorage *)0x0) {
    plVar11 = &(aVar15.ref)->refCount;
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      (*(aVar15.ref)->_vptr_RefCountedStorage[1])(aVar15.number);
    }
  }
  goto LAB_0012216f;
}

Assistant:

static IntrinsicResult intrinsic_import(Context *context, IntrinsicResult partialResult) {
	if (!partialResult.Result().IsNull()) {
		// When we're invoked with a partial result, it means that the import
		// function has finished, and stored its result (the values that were
		// created by the import code) in Temp 0.
		Value importedValues = context->GetTemp(0);
		// Now we're going to do something slightly evil.  We're going to reach
		// up into the *parent* context, and store these imported values under
		// the import library name.  Thus, there will always be a standard name
		// by which you can refer to the imported stuff.
		String libname = partialResult.Result().ToString();
		Context *callerContext = context->parent;
		callerContext->SetVar(libname, importedValues);
		return IntrinsicResult::Null;
	}
	// When we're invoked without a partial result, it's time to start the import.
	// Begin by finding the actual code.
	String libname = context->GetVar("libname").ToString();
	if (libname.empty()) {
		RuntimeException("import: libname required").raise();
	}
	
	// Figure out what directories to look for the import modules in.
	Value searchPath = getEnvMap().Lookup(_MS_IMPORT_PATH, Value::null);
	StringList libDirs;
	if (!searchPath.IsNull()) libDirs = Split(searchPath.ToString(), ":");
	
	// Search the lib dirs for a matching file.
	String moduleSource;
	bool found = false;
	for (long i=0, len=libDirs.Count(); i<len; i++) {
		String path = libDirs[i];
		if (path.empty()) path = ".";
		else if (path[path.LengthB() - 1] != PATHSEP) path += String(PATHSEP);
		path += libname + ".ms";
		path = ExpandVariables(path);
		FILE *handle = fopen(path.c_str(), "r");
		if (handle == nullptr) continue;
		moduleSource = ReadFileHelper(handle, -1);
		fclose(handle);
		found = true;
		break;
	}
	if (!found) {
		RuntimeException("import: library not found: " + libname).raise();
	}
	
	// Now, parse that code, and build a function around it that returns
	// its own locals as its result.  Push a manual call.
	Parser parser;
	parser.errorContext = libname + ".ms";
	parser.Parse(moduleSource);
	FunctionStorage *import = parser.CreateImport();
	context->vm->ManuallyPushCall(import, Value::Temp(0));
	
	// That call will not be able to run until we return from this intrinsic.
	// So, return a partial result, with the lib name.  We'll get invoked
	// again after the import function has finished running.
	return IntrinsicResult(libname, false);
}